

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonPrintf(int N,JsonString *p,char *zFormat,...)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  undefined8 in_RCX;
  long in_RSI;
  int in_EDI;
  JsonString *in_R8;
  long in_FS_OFFSET;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  u32 N_00;
  
  N_00 = (u32)((ulong)in_RCX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)(*(long *)(in_RSI + 0x18) + (long)in_EDI) < *(ulong *)(in_RSI + 0x10)) ||
     (iVar2 = jsonStringGrow(in_R8,N_00), iVar2 == 0)) {
    sqlite3_vsnprintf(N_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                      in_stack_ffffffffffffff08);
    sVar3 = strlen((char *)(*(long *)(in_RSI + 8) + *(long *)(in_RSI + 0x18)));
    *(long *)(in_RSI + 0x18) = (long)(int)sVar3 + *(long *)(in_RSI + 0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonPrintf(int N, JsonString *p, const char *zFormat, ...){
  va_list ap;
  if( (p->nUsed + N >= p->nAlloc) && jsonStringGrow(p, N) ) return;
  va_start(ap, zFormat);
  sqlite3_vsnprintf(N, p->zBuf+p->nUsed, zFormat, ap);
  va_end(ap);
  p->nUsed += (int)strlen(p->zBuf+p->nUsed);
}